

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

QStringList * QStringConverter::availableCodecs(void)

{
  DataPointer *pDVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  QString *pQVar5;
  storage_type *in_RCX;
  QString *this;
  QList<QString> *in_RDI;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = ucnv_countAvailable_70();
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  QList<QString>::reserve(in_RDI,(long)(iVar2 + 1));
  if (-1 < iVar2) {
    lVar6 = 0;
    do {
      if (lVar6 == 0) {
        ba.m_data = in_RCX;
        ba.m_size = (qsizetype)"Locale";
        QString::fromLatin1(&local_58,(QString *)0x6,ba);
      }
      else {
        local_3c = 0;
        lVar3 = ucnv_getAvailableName_70((int)lVar6 + -1);
        lVar4 = ucnv_getStandardName_70(lVar3,"MIME",&local_3c);
        if ((0 < local_3c) || (lVar4 == 0)) {
          local_3c = 0;
          lVar4 = ucnv_getStandardName_70(lVar3,"IANA",&local_3c);
        }
        if (lVar4 != 0) {
          lVar3 = lVar4;
        }
        if (lVar3 == 0) {
          this = (QString *)0x0;
        }
        else {
          pQVar5 = (QString *)0xffffffffffffffff;
          do {
            this = (QString *)((long)&(pQVar5->d).d + 1);
            pDVar1 = &pQVar5->d;
            pQVar5 = this;
          } while (*(char *)((long)&pDVar1->d + lVar3 + 1) != '\0');
        }
        ba_00.m_data = in_RCX;
        ba_00.m_size = lVar3;
        QString::fromLatin1(&local_58,this,ba_00);
      }
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_58);
      QList<QString>::end(in_RDI);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar2 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QStringConverter::availableCodecs()
{
    auto availableCodec = [](qsizetype index) -> QString
    {
    #if !defined(QT_USE_ICU_CODECS)
        return QString::fromLatin1(encodingInterfaces[index].name);
    #else
        if (index == 0) // "Locale", not provided by icu
            return QString::fromLatin1(
                        encodingInterfaces[QStringConverter::Encoding::System].name);
        QT_COM_THREAD_INIT
        // this mirrors the setup we do to set a converters name
        UErrorCode status = U_ZERO_ERROR;
        auto icuName = ucnv_getAvailableName(int32_t(index - 1));
        const char *standardName = ucnv_getStandardName(icuName, "MIME", &status);
        if (U_FAILURE(status) || !standardName) {
            status = U_ZERO_ERROR;
            standardName = ucnv_getStandardName(icuName, "IANA", &status);
        }
        if (!standardName)
            standardName = icuName;
        return QString::fromLatin1(standardName);
    #endif
    };

    qsizetype codecCount = availableCodecCount();
    QStringList result;
    result.reserve(codecCount);
    for (qsizetype i = 0; i < codecCount; ++i)
        result.push_back(availableCodec(i));
    return result;
}